

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  result rVar5;
  ulong uVar6;
  long lVar7;
  decimal_fp<float> dVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char cVar13;
  ulong uVar14;
  uint uVar15;
  uint64_t uVar16;
  ulong uVar17;
  uint64_t error;
  size_t __len;
  size_t sVar18;
  decimal_fp<double> dVar19;
  fixed_handler handler;
  uint local_74;
  fixed_handler local_70;
  buffer<char> *local_58;
  ulong local_50;
  uint64_t local_48;
  ulong local_40;
  double local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  uVar11 = (ulong)specs & 0xff00000000;
  local_70.fixed = uVar11 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar11 != 0x200000000) {
      sVar18 = buf->size_;
      uVar11 = sVar18 + 1;
      if (buf->capacity_ < uVar11) {
        (**buf->_vptr_buffer)(buf);
        sVar18 = buf->size_;
        uVar11 = sVar18 + 1;
      }
      buf->size_ = uVar11;
      buf->ptr_[sVar18] = '0';
      local_74 = 0;
    }
    else {
      uVar6 = (ulong)(uint)precision;
      uVar11 = buf->capacity_;
      if (uVar11 < uVar6) {
        (**buf->_vptr_buffer)(buf,uVar6);
        uVar11 = buf->capacity_;
      }
      if (uVar6 <= uVar11) {
        uVar11 = uVar6;
      }
      buf->size_ = uVar11;
      memset(buf->ptr_,0x30,uVar6);
      local_74 = -precision;
    }
  }
  else {
    local_50 = (ulong)specs >> 0x20;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      iVar4 = snprintf_float<double>(value,precision,specs,buf);
      return iVar4;
    }
    if (precision < 0) {
      if ((specs._4_4_ >> 0x12 & 1) == 0) {
        dVar19 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar19.significand);
        local_74 = dVar19.exponent;
      }
      else {
        dVar8 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar8.significand);
        local_74 = dVar8.exponent;
      }
    }
    else {
      uVar6 = (ulong)value & 0xfffffffffffff;
      if ((ulong)value >> 0x34 == 0) {
        lVar7 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        uVar6 = uVar6 << (~(byte)lVar7 + 0x35 & 0x3f);
        iVar4 = ((uint)lVar7 ^ 0xffffffc0) - 0x426;
      }
      else {
        uVar6 = uVar6 | 0x10000000000000;
        iVar4 = (uint)((ulong)value >> 0x34) - 0x433;
      }
      iVar3 = (int)((ulong)((long)(-0x32 - iVar4) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar10 = iVar3 + 0x15b;
      uVar15 = iVar3 + 0x162;
      if (-1 < (int)uVar10) {
        uVar15 = uVar10;
      }
      local_40 = (ulong)(uVar15 & 0xfffffff8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar6 << 0xb;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(basic_data<void>::grisu_pow10_significands +
                               (long)((int)uVar15 >> 3) * 8 + 8);
      uVar6 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
      bVar9 = -((char)*(undefined2 *)
                       (basic_data<void>::grisu_pow10_exponents + (long)((int)uVar15 >> 3) * 2 + 2)
               + (char)iVar4) - 0x35;
      local_70.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        local_70.precision = precision;
      }
      local_70.buf = buf->ptr_;
      local_70.size = 0;
      local_70.exp10 = 0x154 - (uVar15 & 0xfffffff8);
      uVar16 = 1L << (bVar9 & 0x3f);
      uVar12 = uVar6 >> (bVar9 & 0x3f);
      uVar15 = (uint)uVar12;
      if (uVar15 == 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      local_38 = value;
      if (uVar12 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      uVar10 = 0x1f;
      if ((uVar15 | 1) != 0) {
        for (; (uVar15 | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      lVar7 = (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar10 * 2) -
              (ulong)(uVar15 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar10 * 2)
                                        * 4));
      local_74 = (uint)lVar7;
      rVar5 = fixed_handler::on_start
                        (&local_70,
                         *(long *)("fmt::detail::bigint::~bigint()" + lVar7 * 8 + 0x17) <<
                         (bVar9 & 0x3f),uVar6 / 10,10,(int *)&local_74);
      if (rVar5 == more) {
        uVar17 = uVar16 - 1;
        uVar6 = uVar6 & uVar17;
        local_58 = buf;
        local_48 = uVar16;
        do {
          uVar15 = local_74 - 1;
          switch((ulong)uVar15) {
          case 0:
            cVar13 = (char)uVar12;
            uVar12 = 0;
            goto LAB_003afda8;
          case 1:
            cVar13 = (char)((uVar12 & 0xffffffff) / 10);
            iVar4 = (int)((uVar12 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar13 = (char)((uVar12 & 0xffffffff) / 100);
            iVar4 = (int)((uVar12 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar13 = (char)((uVar12 & 0xffffffff) / 1000);
            iVar4 = (int)((uVar12 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar13 = (char)((uVar12 & 0xffffffff) / 10000);
            iVar4 = (int)((uVar12 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar14 = uVar12 >> 5 & 0x7ffffff;
            cVar13 = (char)(uVar14 / 0xc35);
            iVar4 = (int)(uVar14 / 0xc35) * 100000;
            break;
          case 6:
            cVar13 = (char)((uVar12 & 0xffffffff) / 1000000);
            iVar4 = (int)((uVar12 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar13 = (char)((uVar12 & 0xffffffff) / 10000000);
            iVar4 = (int)((uVar12 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar13 = (char)((uVar12 & 0xffffffff) / 100000000);
            iVar4 = (int)((uVar12 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar14 = (uVar12 >> 9 & 0x7fffff) * 0x44b83;
            cVar13 = (char)(uVar14 >> 0x27);
            iVar4 = (uint)(uVar14 >> 0x27) * 1000000000;
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          uVar12 = (ulong)(uint)((int)uVar12 - iVar4);
LAB_003afda8:
          local_74 = uVar15;
          rVar5 = fixed_handler::on_digit
                            (&local_70,cVar13 + '0',
                             *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar15 * 8) <<
                             (bVar9 & 0x3f),(uVar12 << (bVar9 & 0x3f)) + uVar6,1,uVar15,true);
          uVar16 = local_48;
          buf = local_58;
          if (rVar5 != more) goto LAB_003afe54;
        } while (0 < (int)local_74);
        error = 1;
        do {
          uVar12 = uVar6 * 10;
          error = error * 10;
          uVar6 = uVar12 & uVar17;
          local_74 = local_74 - 1;
          rVar5 = fixed_handler::on_digit
                            (&local_70,(char)(uVar12 >> (bVar9 & 0x3f)) + '0',uVar16,uVar6,error,
                             local_74,false);
          buf = local_58;
        } while (rVar5 == more);
      }
LAB_003afe54:
      if (rVar5 == error) {
        local_74 = (local_70.size - ((int)local_40 + 8)) + local_74 + 0x15b;
        uVar15 = (uint)local_50;
        fallback_format<double>
                  (local_38,local_70.precision,(bool)((byte)(local_50 >> 0x12) & 1),buf,
                   (int *)&local_74);
      }
      else {
        local_74 = local_74 + local_70.exp10;
        uVar6 = (ulong)local_70.size;
        if ((long)uVar6 < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        uVar12 = buf->capacity_;
        if (uVar12 < uVar6) {
          (**buf->_vptr_buffer)(buf,uVar6);
          uVar12 = buf->capacity_;
        }
        if (uVar12 < uVar6) {
          uVar6 = uVar12;
        }
        buf->size_ = uVar6;
        uVar15 = (uint)local_50;
      }
      if ((uVar15 >> 0x14 & 1) == 0 && uVar11 != 0x200000000) {
        sVar18 = buf->size_;
        if (sVar18 != 0) {
          do {
            uVar15 = local_74 + 1;
            if (buf->ptr_[sVar18 - 1] != '0') {
              uVar11 = buf->capacity_;
              if (uVar11 < sVar18) {
                (**buf->_vptr_buffer)(buf,sVar18);
                uVar11 = buf->capacity_;
              }
              goto LAB_003aff27;
            }
            sVar18 = sVar18 - 1;
            local_74 = uVar15;
          } while (sVar18 != 0);
        }
        uVar11 = buf->capacity_;
        sVar18 = 0;
LAB_003aff27:
        if (uVar11 < sVar18) {
          sVar18 = uVar11;
        }
        buf->size_ = sVar18;
      }
    }
  }
  return local_74;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}